

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_job_help.hh
# Opt level: O0

void add_help_7(QPDFArgParser *ap)

{
  QPDFArgParser *pQVar1;
  allocator<char> local_ba9;
  string local_ba8;
  allocator<char> local_b81;
  string local_b80;
  allocator<char> local_b59;
  string local_b58;
  allocator<char> local_b31;
  string local_b30;
  allocator<char> local_b09;
  string local_b08;
  allocator<char> local_ae1;
  string local_ae0;
  allocator<char> local_ab9;
  string local_ab8;
  allocator<char> local_a91;
  string local_a90;
  allocator<char> local_a69;
  string local_a68;
  allocator<char> local_a41;
  string local_a40;
  allocator<char> local_a19;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  allocator<char> local_979;
  string local_978;
  allocator<char> local_951;
  string local_950;
  allocator<char> local_929;
  string local_928;
  allocator<char> local_901;
  string local_900;
  allocator<char> local_8d9;
  string local_8d8;
  allocator<char> local_8b1;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  allocator<char> local_861;
  string local_860;
  allocator<char> local_839;
  string local_838;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  QPDFArgParser *local_10;
  QPDFArgParser *ap_local;
  
  local_10 = ap;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"--description",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"add-attachment",&local_69)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"set attachment\'s description",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "--description=\"text\"\n\nSupply descriptive text for the attachment, displayed by some\nPDF viewers.\n"
             ,&local_b9);
  QPDFArgParser::addOptionHelp(ap,&local_30,&local_68,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"--replace",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"add-attachment",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"replace attachment with same key",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,
             "Indicate that any existing attachment with the same key should\nbe replaced by the new attachment. Otherwise, qpdf gives an\nerror if an attachment with that key is already present.\n"
             ,&local_159);
  QPDFArgParser::addOptionHelp(pQVar1,&local_e0,&local_108,&local_130,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"copy-attachments",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"copy attachments from another file",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,
             "The options listed below appear between --copy-attachments-from and\nits terminating \"--\".\n\nTo copy attachments from a password-protected file, use\nthe --password option after the file name.\n"
             ,&local_1d1);
  QPDFArgParser::addHelpTopic(pQVar1,&local_180,&local_1a8,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"--prefix",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"copy-attachments",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"key prefix for copying attachments",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "--prefix=prefix\n\nPrepend a prefix to each key; may be needed if there are\nduplicate attachment keys. This affects the key only, not the\nfile name.\n"
             ,&local_271);
  QPDFArgParser::addOptionHelp(pQVar1,&local_1f8,&local_220,&local_248,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"inspection",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"inspect PDF files",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,
             "These options provide tools for inspecting PDF files. When any of\nthe options in this section are specified, no output file may be\ngiven.\n"
             ,&local_2e9);
  QPDFArgParser::addHelpTopic(pQVar1,&local_298,&local_2c0,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"--is-encrypted",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"inspection",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"silently test whether a file is encrypted",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,
             "Silently exit with a code indicating the file\'s encryption status:\n\n0: the file is encrypted\n1: not used\n2: the file is not encrypted\n\nThis can be used with password-protected files even if you don\'t\nknow the password.\n"
             ,&local_389);
  QPDFArgParser::addOptionHelp(pQVar1,&local_310,&local_338,&local_360,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"--requires-password",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"inspection",&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"silently test a file\'s password",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,
             "Silently exit with a code indicating the file\'s password status:\n\n0: a password, other than as supplied, is required\n1: not used\n2: the file is not encrypted\n3: the file is encrypted, and correct password (if any) has been supplied\n"
             ,&local_429);
  QPDFArgParser::addOptionHelp(pQVar1,&local_3b0,&local_3d8,&local_400,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"--check",&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"inspection",&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"partially check whether PDF is valid",&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,
             "Check the structure of the PDF file as well as a number of other\naspects of the file, and write information about the file to\nstandard output. Note that qpdf does not perform any validation\nof the actual PDF page content or semantic correctness of the\nPDF file. It merely checks that the PDF file is syntactically\nvalid. See also qpdf --help=exit-status.\n"
             ,&local_4c9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_450,&local_478,&local_4a0,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"--show-encryption",&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"inspection",&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"information about encrypted files",&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,
             "Show document encryption parameters. Also show the document\'s\nuser password if the owner password is given and the file was\nencrypted using older encryption formats that allow user\npassword recovery.\n"
             ,&local_569);
  QPDFArgParser::addOptionHelp(pQVar1,&local_4f0,&local_518,&local_540,&local_568);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,"--show-encryption-key",&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"inspection",&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e0,"show key with --show-encryption",&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,
             "When used with --show-encryption or --check, causes the\nunderlying encryption key to be displayed.\n"
             ,&local_609);
  QPDFArgParser::addOptionHelp(pQVar1,&local_590,&local_5b8,&local_5e0,&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"--check-linearization",&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"inspection",&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_680,"check linearization tables",&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,
             "Check to see whether a file is linearized and, if so, whether\nthe linearization hint tables are correct.\n"
             ,&local_6a9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_630,&local_658,&local_680,&local_6a8);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d0,"--show-linearization",&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"inspection",&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"show linearization hint tables",&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"Check and display all data in the linearization hint tables.\n",
             &local_749);
  QPDFArgParser::addOptionHelp(pQVar1,&local_6d0,&local_6f8,&local_720,&local_748);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"--show-xref",&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"inspection",&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c0,"show cross reference data",&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,
             "Show the contents of the cross-reference table or stream (object\nlocations in the file) in a human-readable form. This is\nespecially useful for files with cross-reference streams, which\nare stored in a binary format.\n"
             ,&local_7e9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_770,&local_798,&local_7c0,&local_7e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_810,"--show-object",&local_811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,"inspection",&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_860,"show contents of an object",&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,
             "--show-object={trailer|obj[,gen]}\n\nShow the contents of the given object. This is especially useful\nfor inspecting objects that are inside of object streams (also\nknown as \"compressed objects\").\n"
             ,&local_889);
  QPDFArgParser::addOptionHelp(pQVar1,&local_810,&local_838,&local_860,&local_888);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator(&local_861);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator(&local_811);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b0,"--raw-stream-data",&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"inspection",&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_900,"show raw stream data",&local_901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_928,
             "When used with --show-object, if the object is a stream, write\nthe raw (compressed) binary stream data to standard output\ninstead of the object\'s contents. See also\n--filtered-stream-data.\n"
             ,&local_929);
  QPDFArgParser::addOptionHelp(pQVar1,&local_8b0,&local_8d8,&local_900,&local_928);
  std::__cxx11::string::~string((string *)&local_928);
  std::allocator<char>::~allocator(&local_929);
  std::__cxx11::string::~string((string *)&local_900);
  std::allocator<char>::~allocator(&local_901);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_950,"--filtered-stream-data",&local_951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_978,"inspection",&local_979);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a0,"show filtered stream data",&local_9a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c8,
             "When used with --show-object, if the object is a stream, write\nthe filtered (uncompressed, potentially binary) stream data to\nstandard output instead of the object\'s contents. See also\n--raw-stream-data.\n"
             ,&local_9c9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_950,&local_978,&local_9a0,&local_9c8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::allocator<char>::~allocator(&local_9c9);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  std::__cxx11::string::~string((string *)&local_978);
  std::allocator<char>::~allocator(&local_979);
  std::__cxx11::string::~string((string *)&local_950);
  std::allocator<char>::~allocator(&local_951);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,"--show-npages",&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a18,"inspection",&local_a19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a40,"show number of pages",&local_a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a68,
             "Print the number of pages in the input file on a line by itself.\nUseful for scripts.\n"
             ,&local_a69);
  QPDFArgParser::addOptionHelp(pQVar1,&local_9f0,&local_a18,&local_a40,&local_a68);
  std::__cxx11::string::~string((string *)&local_a68);
  std::allocator<char>::~allocator(&local_a69);
  std::__cxx11::string::~string((string *)&local_a40);
  std::allocator<char>::~allocator(&local_a41);
  std::__cxx11::string::~string((string *)&local_a18);
  std::allocator<char>::~allocator(&local_a19);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a90,"--show-pages",&local_a91)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab8,"inspection",&local_ab9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ae0,"display page dictionary information",&local_ae1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b08,
             "Show the object and generation number for each page dictionary\nobject and for each content stream associated with the page.\n"
             ,&local_b09);
  QPDFArgParser::addOptionHelp(pQVar1,&local_a90,&local_ab8,&local_ae0,&local_b08);
  std::__cxx11::string::~string((string *)&local_b08);
  std::allocator<char>::~allocator(&local_b09);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::allocator<char>::~allocator(&local_ae1);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator(&local_ab9);
  std::__cxx11::string::~string((string *)&local_a90);
  std::allocator<char>::~allocator(&local_a91);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b30,"--with-images",&local_b31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b58,"inspection",&local_b59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b80,"include image details with --show-pages",&local_b81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ba8,
             "When used with --show-pages, also shows the object and\ngeneration numbers for the image objects on each page.\n"
             ,&local_ba9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_b30,&local_b58,&local_b80,&local_ba8);
  std::__cxx11::string::~string((string *)&local_ba8);
  std::allocator<char>::~allocator(&local_ba9);
  std::__cxx11::string::~string((string *)&local_b80);
  std::allocator<char>::~allocator(&local_b81);
  std::__cxx11::string::~string((string *)&local_b58);
  std::allocator<char>::~allocator(&local_b59);
  std::__cxx11::string::~string((string *)&local_b30);
  std::allocator<char>::~allocator(&local_b31);
  return;
}

Assistant:

static void add_help_7(QPDFArgParser& ap)
{
ap.addOptionHelp("--description", "add-attachment", "set attachment's description", R"(--description="text"

Supply descriptive text for the attachment, displayed by some
PDF viewers.
)");
ap.addOptionHelp("--replace", "add-attachment", "replace attachment with same key", R"(Indicate that any existing attachment with the same key should
be replaced by the new attachment. Otherwise, qpdf gives an
error if an attachment with that key is already present.
)");
ap.addHelpTopic("copy-attachments", "copy attachments from another file", R"(The options listed below appear between --copy-attachments-from and
its terminating "--".

To copy attachments from a password-protected file, use
the --password option after the file name.
)");
ap.addOptionHelp("--prefix", "copy-attachments", "key prefix for copying attachments", R"(--prefix=prefix

Prepend a prefix to each key; may be needed if there are
duplicate attachment keys. This affects the key only, not the
file name.
)");
ap.addHelpTopic("inspection", "inspect PDF files", R"(These options provide tools for inspecting PDF files. When any of
the options in this section are specified, no output file may be
given.
)");
ap.addOptionHelp("--is-encrypted", "inspection", "silently test whether a file is encrypted", R"(Silently exit with a code indicating the file's encryption status:

0: the file is encrypted
1: not used
2: the file is not encrypted

This can be used with password-protected files even if you don't
know the password.
)");
ap.addOptionHelp("--requires-password", "inspection", "silently test a file's password", R"(Silently exit with a code indicating the file's password status:

0: a password, other than as supplied, is required
1: not used
2: the file is not encrypted
3: the file is encrypted, and correct password (if any) has been supplied
)");
ap.addOptionHelp("--check", "inspection", "partially check whether PDF is valid", R"(Check the structure of the PDF file as well as a number of other
aspects of the file, and write information about the file to
standard output. Note that qpdf does not perform any validation
of the actual PDF page content or semantic correctness of the
PDF file. It merely checks that the PDF file is syntactically
valid. See also qpdf --help=exit-status.
)");
ap.addOptionHelp("--show-encryption", "inspection", "information about encrypted files", R"(Show document encryption parameters. Also show the document's
user password if the owner password is given and the file was
encrypted using older encryption formats that allow user
password recovery.
)");
ap.addOptionHelp("--show-encryption-key", "inspection", "show key with --show-encryption", R"(When used with --show-encryption or --check, causes the
underlying encryption key to be displayed.
)");
ap.addOptionHelp("--check-linearization", "inspection", "check linearization tables", R"(Check to see whether a file is linearized and, if so, whether
the linearization hint tables are correct.
)");
ap.addOptionHelp("--show-linearization", "inspection", "show linearization hint tables", R"(Check and display all data in the linearization hint tables.
)");
ap.addOptionHelp("--show-xref", "inspection", "show cross reference data", R"(Show the contents of the cross-reference table or stream (object
locations in the file) in a human-readable form. This is
especially useful for files with cross-reference streams, which
are stored in a binary format.
)");
ap.addOptionHelp("--show-object", "inspection", "show contents of an object", R"(--show-object={trailer|obj[,gen]}

Show the contents of the given object. This is especially useful
for inspecting objects that are inside of object streams (also
known as "compressed objects").
)");
ap.addOptionHelp("--raw-stream-data", "inspection", "show raw stream data", R"(When used with --show-object, if the object is a stream, write
the raw (compressed) binary stream data to standard output
instead of the object's contents. See also
--filtered-stream-data.
)");
ap.addOptionHelp("--filtered-stream-data", "inspection", "show filtered stream data", R"(When used with --show-object, if the object is a stream, write
the filtered (uncompressed, potentially binary) stream data to
standard output instead of the object's contents. See also
--raw-stream-data.
)");
ap.addOptionHelp("--show-npages", "inspection", "show number of pages", R"(Print the number of pages in the input file on a line by itself.
Useful for scripts.
)");
ap.addOptionHelp("--show-pages", "inspection", "display page dictionary information", R"(Show the object and generation number for each page dictionary
object and for each content stream associated with the page.
)");
ap.addOptionHelp("--with-images", "inspection", "include image details with --show-pages", R"(When used with --show-pages, also shows the object and
generation numbers for the image objects on each page.
)");
}